

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O1

int __thiscall cmCPackExternalGenerator::PackageFiles(cmCPackExternalGenerator *this)

{
  pointer pcVar1;
  cmCPackExternalVersionGenerator *pcVar2;
  cmMakefile *this_00;
  cmCPackLog *this_01;
  long *msg;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Value *this_02;
  StreamWriter *pSVar6;
  char *in_name;
  size_t sVar7;
  uint uVar8;
  string filename;
  Value root;
  StreamWriterBuilder builder;
  ostringstream cmCPackLog_msg;
  ofstream fout;
  long *local_488 [2];
  long local_478 [2];
  string local_468;
  long *local_448;
  long local_438 [2];
  Value local_428;
  StreamWriterBuilder local_400;
  Value local_3d0;
  undefined1 local_3a8 [112];
  ios_base local_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_400);
  Json::Value::Value(&local_3d0,"  ");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"indentation","");
  this_02 = Json::StreamWriterBuilder::operator[](&local_400,&local_468);
  Json::Value::operator=(this_02,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_3d0);
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"package.json","");
  if ((this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmCPackGenerator).packageFileNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)local_488);
  }
  std::ofstream::ofstream(&local_230,(char *)local_488[0],_S_out);
  pSVar6 = Json::StreamWriterBuilder::newStreamWriter(&local_400);
  Json::Value::Value(&local_428,objectValue);
  pcVar2 = (this->Generator)._M_t.
           super___uniq_ptr_impl<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>_>
           .
           super__Head_base<0UL,_cmCPackExternalGenerator::cmCPackExternalVersionGenerator_*,_false>
           ._M_head_impl;
  iVar5 = (*pcVar2->_vptr_cmCPackExternalVersionGenerator[2])(pcVar2,&local_428);
  uVar8 = 0;
  if (iVar5 != 0) {
    iVar5 = (*pSVar6->_vptr_StreamWriter[2])(pSVar6,&local_428,&local_230);
    uVar8 = 0;
    if (iVar5 == 0) {
      pcVar1 = local_3a8 + 0x10;
      local_3a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"CPACK_EXTERNAL_PACKAGE_SCRIPT","");
      in_name = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_3a8);
      if ((pointer)local_3a8._0_8_ != pcVar1) {
        operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
      }
      uVar8 = 1;
      if ((in_name != (char *)0x0) && (*in_name != '\0')) {
        bVar3 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar3) {
          this_00 = (this->super_cmCPackGenerator).MakefileMap;
          local_3a8._0_8_ = pcVar1;
          sVar7 = strlen(in_name);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3a8,in_name,in_name + sVar7);
          bVar3 = cmMakefile::ReadListFile(this_00,(string *)local_3a8);
          if ((pointer)local_3a8._0_8_ != pcVar1) {
            operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
          }
          bVar4 = true;
          if ((cmSystemTools::s_ErrorOccured == false) &&
             (cmSystemTools::s_FatalErrorOccured == false)) {
            bVar4 = cmSystemTools::GetInterruptFlag();
          }
          uVar8 = (uint)(bVar3 & (bVar4 ^ 1U));
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3a8,
                     "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path",0x3f);
          std::ios::widen((char)(ostream *)local_3a8 +
                          (char)*(undefined8 *)(local_3a8._0_8_ + -0x18));
          std::ostream::put((char)local_3a8);
          std::ostream::flush();
          this_01 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          msg = local_448;
          sVar7 = strlen((char *)local_448);
          cmCPackLog::Log(this_01,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackExternalGenerator.cxx"
                          ,0x43,(char *)msg,sVar7);
          if (local_448 != local_438) {
            operator_delete(local_448,local_438[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
          std::ios_base::~ios_base(local_338);
          uVar8 = 0;
        }
      }
    }
  }
  Json::Value::~Value(&local_428);
  if (pSVar6 != (StreamWriter *)0x0) {
    (*pSVar6->_vptr_StreamWriter[1])(pSVar6);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _vtable;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_488[0] != local_478) {
    operator_delete(local_488[0],local_478[0] + 1);
  }
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_400);
  return uVar8;
}

Assistant:

int cmCPackExternalGenerator::PackageFiles()
{
  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";

  std::string filename = "package.json";
  if (!this->packageFileNames.empty()) {
    filename = this->packageFileNames[0];
  }

  cmsys::ofstream fout(filename.c_str());
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());

  Json::Value root(Json::objectValue);

  if (!this->Generator->WriteToJSON(root)) {
    return 0;
  }

  if (jout->write(root, &fout)) {
    return 0;
  }

  const char* packageScript = this->GetOption("CPACK_EXTERNAL_PACKAGE_SCRIPT");
  if (packageScript && *packageScript) {
    if (!cmSystemTools::FileIsFullPath(packageScript)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_EXTERNAL_PACKAGE_SCRIPT does not contain a full file path"
          << std::endl);
      return 0;
    }

    bool res = this->MakefileMap->ReadListFile(packageScript);

    if (cmSystemTools::GetErrorOccuredFlag() || !res) {
      return 0;
    }
  }

  return 1;
}